

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

char * fy_token_get_text0(fy_token *fyt)

{
  char *pcVar1;
  
  if (fyt != (fy_token *)0x0) {
    pcVar1 = fyt->text0;
    if (pcVar1 == (char *)0x0) {
      fy_token_prepare_text(fyt);
      pcVar1 = fyt->text0;
    }
    return pcVar1;
  }
  return "";
}

Assistant:

const char *fy_token_get_text0(struct fy_token *fyt) {
    /* return empty */
    if (!fyt)
        return "";

    /* created text is always zero terminated */
    if (!fyt->text0)
        fy_token_prepare_text(fyt);

    return fyt->text0;
}